

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O1

void __thiscall FlickerRemover::reset(FlickerRemover *this)

{
  pointer pUVar1;
  pointer pUVar2;
  ulong uVar3;
  UMat *pUVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  pointer this_00;
  Scalar_<double> local_68;
  _InputArray local_48;
  
  clear(this);
  (this->corresponding_frames_similarity_levels).count_of_elements = 0;
  (this->corresponding_frames_similarity_levels).first_element_index = 0;
  (this->corresponding_frames_similarity_levels).last_element_index = 0;
  uVar3 = (ulong)(this->corresponding_frames_similarity_levels).count_of_slots;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      (this->corresponding_frames_similarity_levels).data[uVar5] = (UMat *)0x0;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  (this->adjacent_frames_similarity_levels).count_of_elements = 0;
  (this->adjacent_frames_similarity_levels).first_element_index = 0;
  (this->adjacent_frames_similarity_levels).last_element_index = 0;
  uVar3 = (ulong)(this->adjacent_frames_similarity_levels).count_of_slots;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      (this->adjacent_frames_similarity_levels).data[uVar5] = (UMat *)0x0;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_48.flags = -0x3efdfffa;
  local_48.sz.width = 1;
  local_48.sz.height = 4;
  local_48.obj = &local_68;
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->flicker_counter,&local_48);
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_48.flags = -0x3efdfffa;
  local_48.sz.width = 1;
  local_48.sz.height = 4;
  local_48.obj = &local_68;
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->corresponding_frames_similarity_sum,&local_48);
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
  local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_48.flags = -0x3efdfffa;
  local_48.sz.width = 1;
  local_48.sz.height = 4;
  local_48.obj = &local_68;
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->adjacent_frames_similarity_sum,&local_48);
  pUVar1 = (this->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar2 = (this->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      cv::UMat::~UMat(this_00);
      this_00 = this_00 + 0x50;
    } while (this_00 != pUVar2);
    (this->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar1;
  }
  std::vector<cv::UMat,_std::allocator<cv::UMat>_>::reserve
            (&this->masks,(ulong)this->number_of_masks);
  uVar6 = this->number_of_masks;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      local_48.flags = 3;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      std::vector<cv::UMat,std::allocator<cv::UMat>>::
      emplace_back<int_const&,int_const&,int,cv::Scalar_<double>>
                ((vector<cv::UMat,std::allocator<cv::UMat>> *)&this->masks,&this->frame_rows,
                 &this->frame_cols,&local_48.flags,&local_68);
      uVar7 = uVar7 + 1;
      uVar6 = this->number_of_masks;
    } while (uVar7 < uVar6);
  }
  this->actual_mask = uVar6;
  if (this->block_size != 0) {
    uVar6 = 0;
    do {
      pUVar4 = (UMat *)operator_new(0x50);
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      cv::UMat::UMat(pUVar4,this->frame_rows,this->frame_cols,0,&local_68,0);
      CircularBuffer<cv::UMat_*>::push(&this->corresponding_frames_similarity_levels,pUVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->block_size);
  }
  if (this->block_size != 1) {
    uVar6 = 0;
    do {
      pUVar4 = (UMat *)operator_new(0x50);
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      local_68.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      cv::UMat::UMat(pUVar4,this->frame_rows,this->frame_cols,0,&local_68,0);
      CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->block_size - 1);
  }
  (this->frames_block).count_of_elements = 0;
  (this->frames_block).first_element_index = 0;
  (this->frames_block).last_element_index = 0;
  uVar3 = (ulong)(this->frames_block).count_of_slots;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      (this->frames_block).data[uVar5] = (UMat *)0x0;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void FlickerRemover::reset()
{
    clear();
    corresponding_frames_similarity_levels.clear();
    adjacent_frames_similarity_levels.clear();
    flicker_counter.setTo(Scalar(0));
    corresponding_frames_similarity_sum.setTo(Scalar(0));
    adjacent_frames_similarity_sum.setTo(Scalar(0));
    masks.clear();
    masks.reserve(number_of_masks);
    for(unsigned int j = 0; j < number_of_masks; j++) {
        masks.emplace_back(frame_rows, frame_cols, CV_16S, Scalar(0));
    }
    actual_mask = number_of_masks;
    for(unsigned int j = 0; j < block_size; j++) {
        corresponding_frames_similarity_levels.push(new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0)));
    }
    for(unsigned int j = 0; j < block_size - 1; j++) {
        adjacent_frames_similarity_levels.push(new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0)));
    }
    frames_block.clear();
}